

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

void HUF_fillDTableX2Level2
               (HUF_DEltX2 *DTable,U32 sizeLog,U32 consumed,U32 *rankValOrigin,int minWeight,
               sortedSymbol_t *sortedSymbols,U32 sortedListSize,U32 nbBitsBaseline,U16 baseSeq,
               U32 *wksp,size_t wkspSize)

{
  U32 UVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint local_64;
  U32 end;
  U32 i_1;
  U32 start;
  U32 length;
  U32 nbBits;
  U32 weight;
  U32 symbol;
  U32 s;
  U32 skipSize;
  U32 i;
  U32 *rankVal;
  sortedSymbol_t *psStack_30;
  HUF_DEltX2 DElt;
  sortedSymbol_t *sortedSymbols_local;
  int minWeight_local;
  U32 *rankValOrigin_local;
  U32 consumed_local;
  U32 sizeLog_local;
  HUF_DEltX2 *DTable_local;
  
  psStack_30 = sortedSymbols;
  memcpy(wksp,rankValOrigin,0x34);
  if (1 < minWeight) {
    uVar3 = wksp[minWeight];
    MEM_writeLE16((void *)((long)&rankVal + 4),baseSeq);
    rankVal._4_3_ = CONCAT12((char)consumed,rankVal._4_2_);
    rankVal._4_4_ = (HUF_DEltX2)CONCAT13('\x01',rankVal._4_3_);
    for (s = 0; s < uVar3; s = s + 1) {
      DTable[s] = rankVal._4_4_;
    }
  }
  for (weight = 0; weight < sortedListSize; weight = weight + 1) {
    uVar3 = (uint)psStack_30[weight].weight;
    cVar2 = (char)nbBitsBaseline - psStack_30[weight].weight;
    iVar4 = 1 << ((char)sizeLog - cVar2 & 0x1fU);
    UVar1 = wksp[uVar3];
    MEM_writeLE16((void *)((long)&rankVal + 4),baseSeq + (ushort)psStack_30[weight].symbol * 0x100);
    rankVal._4_3_ = CONCAT12(cVar2 + (char)consumed,rankVal._4_2_);
    rankVal._4_4_ = (HUF_DEltX2)CONCAT13('\x02',rankVal._4_3_);
    local_64 = UVar1;
    do {
      uVar5 = local_64 + 1;
      DTable[local_64] = rankVal._4_4_;
      local_64 = uVar5;
    } while (uVar5 < UVar1 + iVar4);
    wksp[uVar3] = iVar4 + wksp[uVar3];
  }
  return;
}

Assistant:

static void HUF_fillDTableX2Level2(HUF_DEltX2* DTable, U32 sizeLog, const U32 consumed,
                           const U32* rankValOrigin, const int minWeight,
                           const sortedSymbol_t* sortedSymbols, const U32 sortedListSize,
                           U32 nbBitsBaseline, U16 baseSeq, U32* wksp, size_t wkspSize)
{
    HUF_DEltX2 DElt;
    U32* rankVal = wksp;

    assert(wkspSize >= HUF_TABLELOG_MAX + 1);
    (void)wkspSize;
    /* get pre-calculated rankVal */
    ZSTD_memcpy(rankVal, rankValOrigin, sizeof(U32) * (HUF_TABLELOG_MAX + 1));

    /* fill skipped values */
    if (minWeight>1) {
        U32 i, skipSize = rankVal[minWeight];
        MEM_writeLE16(&(DElt.sequence), baseSeq);
        DElt.nbBits   = (BYTE)(consumed);
        DElt.length   = 1;
        for (i = 0; i < skipSize; i++)
            DTable[i] = DElt;
    }

    /* fill DTable */
    {   U32 s; for (s=0; s<sortedListSize; s++) {   /* note : sortedSymbols already skipped */
            const U32 symbol = sortedSymbols[s].symbol;
            const U32 weight = sortedSymbols[s].weight;
            const U32 nbBits = nbBitsBaseline - weight;
            const U32 length = 1 << (sizeLog-nbBits);
            const U32 start = rankVal[weight];
            U32 i = start;
            const U32 end = start + length;

            MEM_writeLE16(&(DElt.sequence), (U16)(baseSeq + (symbol << 8)));
            DElt.nbBits = (BYTE)(nbBits + consumed);
            DElt.length = 2;
            do { DTable[i++] = DElt; } while (i<end);   /* since length >= 1 */

            rankVal[weight] += length;
    }   }
}